

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O0

void __thiscall BBDT<UF>::SecondScan(BBDT<UF> *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uint *puVar7;
  uint uVar8;
  bool bVar9;
  int iLabel_3;
  int iLabel_2;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_1;
  int iLabel_1;
  int iLabel;
  int c;
  uint *img_labels_row_fol;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row;
  int r;
  bool o_cols;
  int e_cols;
  bool o_rows;
  int e_rows;
  BBDT<UF> *this_local;
  
  uVar4 = UF::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  uVar4 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
  uVar8 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc &
          0xfffffffe;
  bVar9 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc % 2
          == 1;
  for (img_row._4_4_ = 0; img_row._4_4_ < (int)(uVar4 & 0xfffffffe);
      img_row._4_4_ = img_row._4_4_ + 2) {
    puVar6 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iLabel_1 = 0; iLabel_1 < (int)uVar8; iLabel_1 = iLabel_1 + 2) {
      if ((int)puVar7[iLabel_1] < 1) {
        puVar7[iLabel_1] = 0;
        puVar7[iLabel_1 + 1] = 0;
        *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar3) = 0;
        *(undefined4 *)((long)puVar7 + (long)(iLabel_1 + 1) * 4 + lVar3) = 0;
      }
      else {
        uVar5 = UF::GetLabel(puVar7[iLabel_1]);
        if (puVar6[iLabel_1] == '\0') {
          puVar7[iLabel_1] = 0;
        }
        else {
          puVar7[iLabel_1] = uVar5;
        }
        if (puVar6[iLabel_1 + 1] == '\0') {
          puVar7[iLabel_1 + 1] = 0;
        }
        else {
          puVar7[iLabel_1 + 1] = uVar5;
        }
        if (puVar6[iLabel_1 + lVar2] == '\0') {
          *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar3) = 0;
        }
        else {
          *(uint *)((long)puVar7 + (long)iLabel_1 * 4 + lVar3) = uVar5;
        }
        if (puVar6[(iLabel_1 + 1) + lVar2] == '\0') {
          *(undefined4 *)((long)puVar7 + (long)(iLabel_1 + 1) * 4 + lVar3) = 0;
        }
        else {
          *(uint *)((long)puVar7 + (long)(iLabel_1 + 1) * 4 + lVar3) = uVar5;
        }
      }
    }
    if (bVar9) {
      if ((int)puVar7[iLabel_1] < 1) {
        puVar7[iLabel_1] = 0;
        *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar3) = 0;
      }
      else {
        uVar5 = UF::GetLabel(puVar7[iLabel_1]);
        if (puVar6[iLabel_1] == '\0') {
          puVar7[iLabel_1] = 0;
        }
        else {
          puVar7[iLabel_1] = uVar5;
        }
        if (puVar6[iLabel_1 + lVar2] == '\0') {
          *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar3) = 0;
        }
        else {
          *(uint *)((long)puVar7 + (long)iLabel_1 * 4 + lVar3) = uVar5;
        }
      }
    }
  }
  if (iVar1 % 2 == 1) {
    puVar6 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    for (iLabel_3 = 0; iLabel_3 < (int)uVar8; iLabel_3 = iLabel_3 + 2) {
      if ((int)puVar7[iLabel_3] < 1) {
        puVar7[iLabel_3] = 0;
        puVar7[iLabel_3 + 1] = 0;
      }
      else {
        uVar4 = UF::GetLabel(puVar7[iLabel_3]);
        if (puVar6[iLabel_3] == '\0') {
          puVar7[iLabel_3] = 0;
        }
        else {
          puVar7[iLabel_3] = uVar4;
        }
        if (puVar6[iLabel_3 + 1] == '\0') {
          puVar7[iLabel_3 + 1] = 0;
        }
        else {
          puVar7[iLabel_3 + 1] = uVar4;
        }
      }
    }
    if (bVar9) {
      if ((int)puVar7[iLabel_3] < 1) {
        puVar7[iLabel_3] = 0;
      }
      else {
        uVar4 = UF::GetLabel(puVar7[iLabel_3]);
        if (puVar6[iLabel_3] == '\0') {
          puVar7[iLabel_3] = 0;
        }
        else {
          puVar7[iLabel_3] = uVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void SecondScan()
    {   // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }
    }